

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void transaction_tests::CreateCreditAndSpend
               (FillableSigningProvider *keystore,CScript *outscript,CTransactionRef *output,
               CMutableTransaction *input,bool success)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  reference pvVar6;
  size_type sVar7;
  Txid *pTVar8;
  reference pvVar9;
  byte in_R8B;
  long in_FS_OFFSET;
  bool ret;
  DataStream ssin;
  CMutableTransaction inputm;
  DataStream ssout;
  CMutableTransaction outputm;
  SignatureData empty;
  SignatureData *in_stack_fffffffffffff9d8;
  CTxIn *in_stack_fffffffffffff9e0;
  CTxIn *in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  undefined8 in_stack_fffffffffffffa10;
  CMutableTransaction *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  SigningProvider *in_stack_fffffffffffffa28;
  SignatureData *this;
  bool local_48;
  bool bStack_47;
  undefined6 uStack_46;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff9d8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (in_stack_fffffffffffff9f8,CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0)
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  COutPoint::SetNull((COutPoint *)in_stack_fffffffffffff9d8);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = (char *)0x0;
  CScript::CScript((CScript *)in_stack_fffffffffffff9d8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  CScript::operator=((CScript *)in_stack_fffffffffffff9e8,(CScript *)in_stack_fffffffffffff9e0);
  CScript::~CScript((CScript *)in_stack_fffffffffffff9d8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9f8,
             CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9e8,
                      (size_type)in_stack_fffffffffffff9e0);
  pvVar6->nValue = 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  CScript::operator=((CScript *)in_stack_fffffffffffff9e8,(CScript *)in_stack_fffffffffffff9e0);
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff9d8);
  TransactionSerParams::operator()
            ((TransactionSerParams *)in_stack_fffffffffffff9e8,
             (CMutableTransaction *)in_stack_fffffffffffff9e0);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffff9e8,
             (ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)in_stack_fffffffffffff9e0);
  TransactionSerParams::operator()
            ((TransactionSerParams *)in_stack_fffffffffffff9e8,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff9e0);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffff9e8,
             (ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)
             in_stack_fffffffffffff9e0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff9d8);
  sVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9d8);
  if (sVar7 != 1) {
    __assert_fail("output->vin.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d0,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff9d8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  bVar4 = ::operator==(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  if (!bVar4) {
    __assert_fail("output->vin[0] == outputm.vin[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d1,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff9d8);
  sVar7 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9d8);
  if (sVar7 != 1) {
    __assert_fail("output->vout.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d2,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff9d8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  bVar4 = ::operator==((CTxOut *)in_stack_fffffffffffff9e8,(CTxOut *)in_stack_fffffffffffff9e0);
  if (!bVar4) {
    __assert_fail("output->vout[0] == outputm.vout[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d3,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff9d8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (in_stack_fffffffffffff9f8,CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0)
            );
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff9d8);
  pTVar8 = CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff9d8);
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,
                      (size_type)in_stack_fffffffffffff9e0);
  uVar1 = *(undefined8 *)(pTVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar2 = *(undefined8 *)((pTVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar3 = *(undefined8 *)((pTVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar3;
  *(undefined8 *)(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar1;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar2;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,
                      (size_type)in_stack_fffffffffffff9e0);
  (pvVar9->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9f8,
             CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9e8,
                      (size_type)in_stack_fffffffffffff9e0);
  pvVar6->nValue = 1;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = false;
  bStack_47 = false;
  uStack_46 = 0;
  uStack_40 = (char *)0x0;
  this = (SignatureData *)&stack0xffffffffffffffb8;
  CScript::CScript((CScript *)in_stack_fffffffffffff9d8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  CScript::operator=((CScript *)in_stack_fffffffffffff9e8,(CScript *)in_stack_fffffffffffff9e0);
  CScript::~CScript((CScript *)in_stack_fffffffffffff9d8);
  SignatureData::SignatureData(this);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff9e8);
  bVar4 = SignSignature(in_stack_fffffffffffffa28,
                        (CTransaction *)
                        CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
                        in_stack_fffffffffffffa18,(uint)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                        (int)in_stack_fffffffffffffa10,
                        (SignatureData *)
                        CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
  if (bVar4 != (bool)(in_R8B & 1)) {
    __assert_fail("ret == success",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1df,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff9d8);
  TransactionSerParams::operator()
            ((TransactionSerParams *)in_stack_fffffffffffff9e8,
             (CMutableTransaction *)in_stack_fffffffffffff9e0);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffff9e8,
             (ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)in_stack_fffffffffffff9e0);
  TransactionSerParams::operator()
            ((TransactionSerParams *)in_stack_fffffffffffff9e8,
             (CMutableTransaction *)in_stack_fffffffffffff9e0);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffff9e8,
             (ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)in_stack_fffffffffffff9e0);
  sVar7 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9d8);
  if (sVar7 != 1) {
    __assert_fail("input.vin.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1e3,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,
             (size_type)in_stack_fffffffffffff9e0);
  bVar4 = ::operator==(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  if (!bVar4) {
    __assert_fail("input.vin[0] == inputm.vin[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1e4,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  sVar7 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9d8);
  if (sVar7 == 1) {
    pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9e8,
                        (size_type)in_stack_fffffffffffff9e0);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff9e8,
               (size_type)in_stack_fffffffffffff9e0);
    uVar5 = ::operator==((CTxOut *)in_stack_fffffffffffff9e8,(CTxOut *)in_stack_fffffffffffff9e0);
    if (!(bool)uVar5) {
      __assert_fail("input.vout[0] == inputm.vout[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                    ,0x1e6,
                    "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                   );
    }
    sVar7 = 0;
    pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff9e8,0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&pvVar9->scriptWitness,sVar7);
    bVar4 = std::operator==((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)CONCAT17(uVar5,in_stack_fffffffffffffa08),
                            (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)pvVar6);
    if (!bVar4) {
      __assert_fail("input.vin[0].scriptWitness.stack == inputm.vin[0].scriptWitness.stack",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                    ,0x1e7,
                    "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                   );
    }
    DataStream::~DataStream((DataStream *)in_stack_fffffffffffff9d8);
    SignatureData::~SignatureData(in_stack_fffffffffffff9d8);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff9d8);
    DataStream::~DataStream((DataStream *)in_stack_fffffffffffff9d8);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff9d8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("input.vout.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                ,0x1e5,
                "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
               );
}

Assistant:

static void CreateCreditAndSpend(const FillableSigningProvider& keystore, const CScript& outscript, CTransactionRef& output, CMutableTransaction& input, bool success = true)
{
    CMutableTransaction outputm;
    outputm.version = 1;
    outputm.vin.resize(1);
    outputm.vin[0].prevout.SetNull();
    outputm.vin[0].scriptSig = CScript();
    outputm.vout.resize(1);
    outputm.vout[0].nValue = 1;
    outputm.vout[0].scriptPubKey = outscript;
    DataStream ssout;
    ssout << TX_WITH_WITNESS(outputm);
    ssout >> TX_WITH_WITNESS(output);
    assert(output->vin.size() == 1);
    assert(output->vin[0] == outputm.vin[0]);
    assert(output->vout.size() == 1);
    assert(output->vout[0] == outputm.vout[0]);

    CMutableTransaction inputm;
    inputm.version = 1;
    inputm.vin.resize(1);
    inputm.vin[0].prevout.hash = output->GetHash();
    inputm.vin[0].prevout.n = 0;
    inputm.vout.resize(1);
    inputm.vout[0].nValue = 1;
    inputm.vout[0].scriptPubKey = CScript();
    SignatureData empty;
    bool ret = SignSignature(keystore, *output, inputm, 0, SIGHASH_ALL, empty);
    assert(ret == success);
    DataStream ssin;
    ssin << TX_WITH_WITNESS(inputm);
    ssin >> TX_WITH_WITNESS(input);
    assert(input.vin.size() == 1);
    assert(input.vin[0] == inputm.vin[0]);
    assert(input.vout.size() == 1);
    assert(input.vout[0] == inputm.vout[0]);
    assert(input.vin[0].scriptWitness.stack == inputm.vin[0].scriptWitness.stack);
}